

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonPal.h
# Opt level: O0

void TryFinally<Js::CrossSite::CommonThunk(Js::RecyclableObject*,void*(*)(Js::RecyclableObject*,Js::CallInfo,___),Js::Arguments)::__0,Js::CrossSite::CommonThunk(Js::RecyclableObject*,void*(*)(Js::RecyclableObject*,Js::CallInfo,___),Js::Arguments)::__1>
               (anon_class_96_12_d6763c94 *tryFunc,anon_class_48_6_9e8417c9 *finallyFunc)

{
  undefined1 local_28 [8];
  FinallyObject finallyObject;
  anon_class_48_6_9e8417c9 *finallyFunc_local;
  anon_class_96_12_d6763c94 *tryFunc_local;
  
  finallyObject._8_8_ = finallyFunc;
  TryFinally<Js::CrossSite::CommonThunk(Js::RecyclableObject*,void*(*)(Js::RecyclableObject*,Js::
  CallInfo,...),Js::Arguments)::$_0,Js::CrossSite::CommonThunk(Js::RecyclableObject*,void*(*)(Js::
  RecyclableObject*,Js::CallInfo,...),Js::Arguments)::$_1>(Js::CrossSite::CommonThunk(Js::
  RecyclableObject*,void*(*)(Js::RecyclableObject*,Js::CallInfo,...),Js::Arguments)::$_0_const&,Js::
  CrossSite::CommonThunk(Js::RecyclableObject*,void*(*)(Js::RecyclableObject*,Js::CallInfo,...),Js::
  Arguments)::$_1_const&)::FinallyObject::FinallyObject(Js::CrossSite::
  CommonThunk(Js::RecyclableObject*,void*(*)(Js::RecyclableObject*,Js::CallInfo,...),Js::Arguments)
  ::__1_const__(local_28,finallyFunc);
  Js::CrossSite::CommonThunk::anon_class_96_12_d6763c94::operator()(tryFunc);
  TryFinally<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp:533:20),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp:562:9)>
  ::FinallyObject::SetHasNoAbnormalTermination((FinallyObject *)local_28);
  TryFinally<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp:533:20),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp:562:9)>
  ::FinallyObject::~FinallyObject((FinallyObject *)local_28);
  return;
}

Assistant:

void TryFinally(const TryFunc& tryFunc, const FinallyFunc& finallyFunc)
{
    class FinallyObject
    {
    public:
        FinallyObject(const FinallyFunc& finallyFunc) : finallyFunc(finallyFunc), abnormalTermination(true) {}
        ~FinallyObject() { finallyFunc(abnormalTermination); }

        void SetHasNoAbnormalTermination() { abnormalTermination = false; }
    private:
        const FinallyFunc& finallyFunc;
        bool abnormalTermination;
    } finallyObject(finallyFunc);

    tryFunc();
    finallyObject.SetHasNoAbnormalTermination();
}